

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void initJavaData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar4;
  long lVar5;
  QMultiHash<char,_QLatin1String> moved;
  char local_549;
  QMultiHash<char,_QLatin1String> local_548;
  iterator local_538;
  undefined1 local_520 [16];
  char *local_510;
  undefined1 local_508;
  undefined8 local_500;
  char *local_4f8;
  undefined1 local_4f0;
  undefined8 local_4e8;
  char *local_4e0;
  undefined1 local_4d8;
  undefined8 local_4d0;
  char *local_4c8;
  undefined1 local_4c0;
  undefined8 local_4b8;
  char *local_4b0;
  undefined1 local_4a8;
  undefined8 local_4a0;
  char *local_498;
  undefined1 local_490;
  undefined8 local_488;
  char *local_480;
  undefined1 local_478;
  undefined8 local_470;
  char *local_468;
  undefined1 local_460;
  undefined8 local_458;
  char *local_450;
  undefined1 local_448;
  undefined8 local_440;
  char *local_438;
  undefined1 local_430;
  undefined8 local_428;
  char *local_420;
  undefined1 local_418;
  undefined8 local_410;
  char *local_408;
  undefined1 local_400;
  undefined8 local_3f8;
  char *local_3f0;
  undefined1 local_3e8;
  undefined8 local_3e0;
  char *local_3d8;
  undefined1 local_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  undefined1 local_3b8;
  undefined8 local_3b0;
  char *local_3a8;
  undefined1 local_3a0;
  undefined8 local_398;
  char *local_390;
  undefined1 local_388;
  undefined8 local_380;
  char *local_378;
  undefined1 local_370;
  undefined8 local_368;
  char *local_360;
  undefined1 local_358;
  undefined8 local_350;
  char *local_348;
  undefined1 local_340;
  undefined8 local_338;
  char *local_330;
  undefined1 local_328;
  undefined8 local_320;
  char *local_318;
  undefined1 local_310;
  undefined8 local_308;
  char *local_300;
  undefined1 local_2f8;
  undefined8 local_2f0;
  char *local_2e8;
  undefined1 local_2e0;
  undefined8 local_2d8;
  char *local_2d0;
  undefined1 local_2c8;
  undefined8 local_2c0;
  char *local_2b8;
  undefined1 local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined1 local_298;
  undefined8 local_290;
  char *local_288;
  undefined1 local_280;
  undefined8 local_278;
  char *local_270;
  undefined1 local_268;
  undefined8 local_260;
  char *local_258;
  undefined1 local_250;
  undefined8 local_248;
  char *local_240;
  undefined1 local_238;
  undefined8 local_230;
  char *local_228;
  undefined1 local_220;
  undefined8 local_218;
  char *local_210;
  undefined1 local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined1 local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  undefined1 local_1d8;
  undefined8 local_1d0;
  char *local_1c8;
  undefined1 local_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  undefined1 local_1a8;
  undefined8 local_1a0;
  char *local_198;
  undefined1 local_190;
  undefined8 local_188;
  char *local_180;
  undefined1 local_178;
  undefined8 local_170;
  char *local_168;
  undefined1 local_160;
  undefined8 local_158;
  char *local_150;
  undefined1 local_148;
  undefined8 local_140;
  char *local_138;
  undefined1 local_130;
  undefined8 local_128;
  char *local_120;
  undefined1 local_118;
  undefined8 local_110;
  char *local_108;
  undefined1 local_100;
  undefined8 local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined1 local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined1 local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined1 local_a0;
  undefined8 local_98;
  char *local_90;
  undefined1 local_88;
  undefined8 local_80;
  char *local_78;
  undefined1 local_70;
  undefined8 local_68;
  char *local_60;
  undefined1 local_58;
  undefined8 local_50;
  char *local_48;
  undefined1 local_40;
  undefined8 local_38;
  char *local_30;
  
  local_520[0] = 0x61;
  local_520._8_8_ = 8;
  local_510 = "abstract";
  local_508 = 0x61;
  local_500 = 6;
  local_4f8 = "assert";
  local_4f0 = 0x62;
  local_4e8 = 5;
  local_4e0 = "break";
  local_4d8 = 99;
  local_4d0 = 4;
  local_4c8 = "case";
  local_4c0 = 99;
  local_4b8 = 5;
  local_4b0 = "catch";
  local_4a8 = 99;
  local_4a0 = 5;
  local_498 = "const";
  local_490 = 99;
  local_488 = 8;
  local_480 = "continue";
  local_478 = 100;
  local_470 = 7;
  local_468 = "default";
  local_460 = 100;
  local_458 = 2;
  local_450 = "do";
  local_448 = 0x65;
  local_440 = 4;
  local_438 = "else";
  local_430 = 0x65;
  local_428 = 7;
  local_420 = "exports";
  local_418 = 0x65;
  local_410 = 7;
  local_408 = "extends";
  local_400 = 0x66;
  local_3f8 = 5;
  local_3f0 = "final";
  local_3e8 = 0x66;
  local_3e0 = 7;
  local_3d8 = "finally";
  local_3d0 = 0x66;
  local_3c8 = 3;
  local_3c0 = "for";
  local_3b8 = 0x67;
  local_3b0 = 4;
  local_3a8 = "goto";
  local_3a0 = 0x69;
  local_398 = 2;
  local_390 = "if";
  local_388 = 0x69;
  local_380 = 10;
  local_378 = "implements";
  local_370 = 0x69;
  local_368 = 6;
  local_360 = "import";
  local_358 = 0x69;
  local_350 = 10;
  local_348 = "instanceof";
  local_340 = 0x69;
  local_338 = 9;
  local_330 = "interface";
  local_328 = 0x6c;
  local_320 = 4;
  local_318 = "long";
  local_310 = 0x6d;
  local_308 = 6;
  local_300 = "module";
  local_2f8 = 0x6e;
  local_2f0 = 6;
  local_2e8 = "native";
  local_2e0 = 0x6e;
  local_2d8 = 3;
  local_2d0 = "new";
  local_2c8 = 0x6e;
  local_2c0 = 4;
  local_2b8 = "null";
  local_2b0 = 0x6f;
  local_2a8 = 4;
  local_2a0 = "open";
  local_298 = 0x6f;
  local_290 = 5;
  local_288 = "opens";
  local_280 = 0x70;
  local_278 = 7;
  local_270 = "package";
  local_268 = 0x70;
  local_260 = 7;
  local_258 = "private";
  local_250 = 0x70;
  local_248 = 9;
  local_240 = "protected";
  local_238 = 0x70;
  local_230 = 8;
  local_228 = "provides";
  local_220 = 0x70;
  local_218 = 6;
  local_210 = "public";
  local_208 = 0x72;
  local_200 = 8;
  local_1f8 = "requires";
  local_1f0 = 0x72;
  local_1e8 = 6;
  local_1e0 = "return";
  local_1d8 = 0x73;
  local_1d0 = 6;
  local_1c8 = "static";
  local_1c0 = 0x73;
  local_1b8 = 8;
  local_1b0 = "strictfp";
  local_1a8 = 0x73;
  local_1a0 = 5;
  local_198 = "super";
  local_190 = 0x73;
  local_188 = 6;
  local_180 = "switch";
  local_178 = 0x73;
  local_170 = 0xc;
  local_168 = "synchronized";
  local_160 = 0x74;
  local_158 = 4;
  local_150 = "this";
  local_148 = 0x74;
  local_140 = 5;
  local_138 = "throw";
  local_130 = 0x74;
  local_128 = 6;
  local_120 = "throws";
  local_118 = 0x74;
  local_110 = 2;
  local_108 = "to";
  local_100 = 0x74;
  local_f8 = 9;
  local_f0 = "transient";
  local_e8 = 0x74;
  local_e0 = 10;
  local_d8 = "transitive";
  local_d0 = 0x74;
  local_c8 = 3;
  local_c0 = "try";
  local_b8 = 0x75;
  local_b0 = 4;
  local_a8 = "uses";
  local_a0 = 0x76;
  local_98 = 3;
  local_90 = "var";
  local_88 = 0x76;
  local_80 = 8;
  local_78 = "volatile";
  local_70 = 0x77;
  local_68 = 5;
  local_60 = "while";
  local_58 = 0x77;
  local_50 = 4;
  local_48 = "with";
  local_40 = 0x79;
  local_38 = 5;
  local_30 = "yield";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,0x35);
  local_548.m_size = 0;
  lVar5 = 0;
  local_548.d = pDVar4;
  do {
    local_549 = local_520[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_538,&local_548,&local_549,(QLatin1String *)(local_520 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x4f8);
  QVar1.m_size = local_548.m_size;
  QVar1.d = local_548.d;
  local_548.d = (Data *)0x0;
  local_548.m_size = 0;
  local_538.i.d = java_keywords.d;
  local_538.i.bucket = java_keywords.m_size;
  java_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_538);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_548);
  local_520[0] = 0x76;
  local_520._8_8_ = 4;
  local_510 = "void";
  local_508 = 0x66;
  local_500 = 5;
  local_4f8 = "float";
  local_4f0 = 0x62;
  local_4e8 = 7;
  local_4e0 = "boolean";
  local_4d8 = 0x62;
  local_4d0 = 4;
  local_4c8 = "byte";
  local_4c0 = 0x69;
  local_4b8 = 3;
  local_4b0 = "int";
  local_4a8 = 99;
  local_4a0 = 4;
  local_498 = "char";
  local_490 = 99;
  local_488 = 5;
  local_480 = "class";
  local_478 = 100;
  local_470 = 6;
  local_468 = "double";
  local_460 = 0x65;
  local_458 = 4;
  local_450 = "enum";
  local_448 = 0x73;
  local_440 = 5;
  local_438 = "short";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,10);
  local_548.m_size = 0;
  lVar5 = 0;
  local_548.d = pDVar4;
  do {
    local_549 = local_520[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_538,&local_548,&local_549,(QLatin1String *)(local_520 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xf0);
  QVar2.m_size = local_548.m_size;
  QVar2.d = local_548.d;
  local_548.d = (Data *)0x0;
  local_548.m_size = 0;
  local_538.i.d = java_types.d;
  local_538.i.bucket = java_types.m_size;
  java_types = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_538);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_548);
  local_520[0] = 0x66;
  local_520._8_8_ = 5;
  local_510 = "false";
  local_508 = 0x74;
  local_500 = 4;
  local_4f8 = "true";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,2);
  local_548.m_size = 0;
  lVar5 = 0;
  local_548.d = pDVar4;
  do {
    local_549 = local_520[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_538,&local_548,&local_549,(QLatin1String *)(local_520 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x30);
  QVar3.m_size = local_548.m_size;
  QVar3.d = local_548.d;
  local_548.d = (Data *)0x0;
  local_548.m_size = 0;
  local_538.i.d = java_literals.d;
  local_538.i.bucket = java_literals.m_size;
  java_literals = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_538);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_548);
  local_538.i = (piter)ZEXT816(0);
  local_520._8_8_ = java_builtin.m_size;
  local_520._0_8_ = java_builtin.d;
  java_builtin.d = (Data *)0x0;
  java_builtin.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_520);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_538);
  local_538.i = (piter)ZEXT816(0);
  local_520._8_8_ = java_other.m_size;
  local_520._0_8_ = java_other.d;
  java_other.d = (Data *)0x0;
  java_other.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_520);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_538);
  return;
}

Assistant:

void initJavaData() {
    java_keywords = {{('a'), QLatin1String("abstract")},
                     {('a'), QLatin1String("assert")},
                     {('b'), QLatin1String("break")},
                     {('c'), QLatin1String("case")},
                     {('c'), QLatin1String("catch")},
                     {('c'), QLatin1String("const")},
                     {('c'), QLatin1String("continue")},
                     {('d'), QLatin1String("default")},
                     {('d'), QLatin1String("do")},
                     {('e'), QLatin1String("else")},
                     {('e'), QLatin1String("exports")},
                     {('e'), QLatin1String("extends")},
                     {('f'), QLatin1String("final")},
                     {('f'), QLatin1String("finally")},
                     {('f'), QLatin1String("for")},
                     {('g'), QLatin1String("goto")},
                     {('i'), QLatin1String("if")},
                     {('i'), QLatin1String("implements")},
                     {('i'), QLatin1String("import")},
                     {('i'), QLatin1String("instanceof")},
                     {('i'), QLatin1String("interface")},
                     {('l'), QLatin1String("long")},
                     {('m'), QLatin1String("module")},
                     {('n'), QLatin1String("native")},
                     {('n'), QLatin1String("new")},
                     {('n'), QLatin1String("null")},
                     {('o'), QLatin1String("open")},
                     {('o'), QLatin1String("opens")},
                     {('p'), QLatin1String("package")},
                     {('p'), QLatin1String("private")},
                     {('p'), QLatin1String("protected")},
                     {('p'), QLatin1String("provides")},
                     {('p'), QLatin1String("public")},
                     {('r'), QLatin1String("requires")},
                     {('r'), QLatin1String("return")},
                     {('s'), QLatin1String("static")},
                     {('s'), QLatin1String("strictfp")},
                     {('s'), QLatin1String("super")},
                     {('s'), QLatin1String("switch")},
                     {('s'), QLatin1String("synchronized")},
                     {('t'), QLatin1String("this")},
                     {('t'), QLatin1String("throw")},
                     {('t'), QLatin1String("throws")},
                     {('t'), QLatin1String("to")},
                     {('t'), QLatin1String("transient")},
                     {('t'), QLatin1String("transitive")},
                     {('t'), QLatin1String("try")},
                     {('u'), QLatin1String("uses")},
                     {('v'), QLatin1String("var")},
                     {('v'), QLatin1String("volatile")},
                     {('w'), QLatin1String("while")},
                     {('w'), QLatin1String("with")},
                     {('y'), QLatin1String("yield")}};

    java_types = {
        {('v'), QLatin1String("void")},    {('f'), QLatin1String("float")},
        {('b'), QLatin1String("boolean")}, {('b'), QLatin1String("byte")},
        {('i'), QLatin1String("int")},     {('c'), QLatin1String("char")},
        {('c'), QLatin1String("class")},   {('d'), QLatin1String("double")},
        {('e'), QLatin1String("enum")},    {('s'), QLatin1String("short")},

    };

    java_literals = {{('f'), QLatin1String("false")},
                     {('t'), QLatin1String("true")}};

    java_builtin = {

    };

    java_other = {

    };
}